

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSceneComponentParentFilterInfoMSFT *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NextChainResult NVar2;
  XrResult XVar3;
  ulong uVar4;
  string local_118;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a0;
  string local_88;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  
  XVar3 = XR_SUCCESS;
  if (value->type != XR_TYPE_SCENE_COMPONENT_PARENT_FILTER_INFO_MSFT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSceneComponentParentFilterInfoMSFT",
               value->type,"VUID-XrSceneComponentParentFilterInfoMSFT-type-type",
               XR_TYPE_SCENE_COMPONENT_PARENT_FILTER_INFO_MSFT,
               "XR_TYPE_SCENE_COMPONENT_PARENT_FILTER_INFO_MSFT");
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (!check_pnext) {
    return XVar3;
  }
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  NVar2 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ","");
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_118,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_118._M_dataplus._M_p);
    paVar1 = &local_118.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"VUID-XrSceneComponentParentFilterInfoMSFT-next-unique","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b8,objects_info);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "Multiple structures of the same type(s) in \"next\" chain for XrSceneComponentParentFilterInfoMSFT struct"
               ,"");
    CoreValidLogMessage(instance_info,&local_118,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_b8,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_b8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      uVar4 = local_118.field_2._M_allocated_capacity + 1;
      local_a0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_118._M_dataplus._M_p;
LAB_001a084d:
      operator_delete(local_a0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,uVar4);
    }
  }
  else {
    if (NVar2 != NEXT_CHAIN_RESULT_ERROR) goto LAB_001a086e;
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,"VUID-XrSceneComponentParentFilterInfoMSFT-next-next","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_a0,objects_info);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,
               "Invalid structure(s) in \"next\" chain for XrSceneComponentParentFilterInfoMSFT struct \"next\""
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_a0,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_a0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar4 = (long)local_a0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_a0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_001a084d;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != &error_message.field_2) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  XVar3 = XR_ERROR_VALIDATION_FAILURE;
LAB_001a086e:
  if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(duplicate_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSceneComponentParentFilterInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SCENE_COMPONENT_PARENT_FILTER_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSceneComponentParentFilterInfoMSFT",
                             value->type, "VUID-XrSceneComponentParentFilterInfoMSFT-type-type", XR_TYPE_SCENE_COMPONENT_PARENT_FILTER_INFO_MSFT, "XR_TYPE_SCENE_COMPONENT_PARENT_FILTER_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSceneComponentParentFilterInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSceneComponentParentFilterInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSceneComponentParentFilterInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSceneComponentParentFilterInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSceneComponentParentFilterInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}